

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemanager.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall FileManager::get_dir(FileManager *this,string *curr_path)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  DIR *__dirp;
  dirent *pdVar1;
  size_t sVar2;
  string dat;
  value_type local_50;
  
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0x18);
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dirp = opendir((curr_path->_M_dataplus)._M_p);
  pdVar1 = readdir(__dirp);
  if (pdVar1 != (dirent *)0x0) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar2 = strlen(pdVar1->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pdVar1->d_name,pdVar1->d_name + sVar2);
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::append((char *)&local_50);
      if (*local_50._M_dataplus._M_p != '.') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,&local_50);
      }
      pdVar1 = readdir(__dirp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (pdVar1 != (dirent *)0x0);
  }
  closedir(__dirp);
  return this_00;
}

Assistant:

std::vector<std::string>* FileManager::get_dir(std::string curr_path) {
    auto directory = new std::vector<std::string>;
    auto dir = opendir(curr_path.data());
    dirent* entry = readdir(dir);
    while (entry != nullptr) {
        std::string dat = entry->d_name;
        dat += "|";
        dat += dirent_type_to_str(entry->d_type);
        if (dat[0] != '.') directory->push_back(dat);
        entry = readdir(dir);
    }
    closedir(dir);
    return directory;
}